

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

int __thiscall QWidgetLineControl::init(QWidgetLineControl *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::setCacheEnabled((bool)((char)this + '\x18'));
  QString::operator=((QString *)(this + 0x18),(QString *)ctx);
  updateDisplayText(this,false);
  *(undefined4 *)(this + 0x40) = *(undefined4 *)(this + 0x28);
  plVar1 = QGuiApplicationPrivate::platform_theme;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_40,QGuiApplicationPrivate::platform_theme,0x16);
    uVar2 = ::QVariant::toInt((bool *)&local_40);
    *(undefined4 *)(this + 300) = uVar2;
    ::QVariant::~QVariant(&local_40);
    (**(code **)(*plVar1 + 0x60))(&local_40,plVar1,6);
    uVar2 = ::QVariant::toInt((bool *)&local_40);
    *(undefined4 *)(this + 0x128) = uVar2;
    ::QVariant::~QVariant(&local_40);
  }
  if (*(int *)(this + 300) - 3U < 3) {
    *(undefined4 *)(this + 300) = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::init(const QString &txt)
{
    m_textLayout.setCacheEnabled(true);
    m_text = txt;
    updateDisplayText();
    m_cursor = m_text.size();
    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
        m_keyboardScheme = theme->themeHint(QPlatformTheme::KeyboardScheme).toInt();
        m_passwordMaskDelay = theme->themeHint(QPlatformTheme::PasswordMaskDelay).toInt();
    }
    // Generalize for X11
    if (m_keyboardScheme == QPlatformTheme::KdeKeyboardScheme
        || m_keyboardScheme == QPlatformTheme::GnomeKeyboardScheme
        || m_keyboardScheme == QPlatformTheme::CdeKeyboardScheme) {
        m_keyboardScheme = QPlatformTheme::X11KeyboardScheme;
    }
}